

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

StructElement * __thiscall
soul::HEARTGenerator::createStructSubElement
          (HEARTGenerator *this,StructMemberRef *member,Expression *source)

{
  pointer pcVar1;
  StructElement *pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (member->memberName)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (member->memberName)._M_string_length);
  pSVar2 = PoolAllocator::
           allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string>
                     (&((this->builder).super_BlockBuilder.module)->allocator->pool,
                      &(source->super_Object).location,source,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pSVar2;
}

Assistant:

heart::StructElement& createStructSubElement (AST::StructMemberRef& member, heart::Expression& source)
    {
        return builder.createStructElement (source, member.memberName);
    }